

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O0

double __thiscall QpVector::norm2(QpVector *this)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RDI;
  HighsInt i;
  double val;
  int local_14;
  double local_10;
  
  local_10 = 0.0;
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_14);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)*pvVar2);
    dVar1 = *pvVar3;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_14);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)*pvVar2);
    local_10 = dVar1 * *pvVar3 + local_10;
  }
  return local_10;
}

Assistant:

double norm2() {
    double val = 0.0;

    for (HighsInt i = 0; i < num_nz; i++) {
      val += value[index[i]] * value[index[i]];
    }

    return val;
  }